

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitPLTerm(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
            *this,PLTerm e)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  int iVar1;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  *this_00;
  BasicWriter<char> *this_01;
  ExprBase e_00;
  long in_RDI;
  int n_1;
  int i_1;
  int n;
  int i;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  BasicStringRef<char> *in_stack_ffffffffffffff30;
  BasicStringRef<char> *this_02;
  type tVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *in_stack_ffffffffffffff38;
  ExprBase in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  double value_04;
  BasicWriter<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  BasicWriter<char> *in_stack_ffffffffffffff60;
  undefined8 uVar3;
  int precedence;
  undefined4 local_4c;
  undefined4 local_24;
  
  uVar3 = *(undefined8 *)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff30,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  value.size_ = (size_t)in_stack_ffffffffffffff60;
  value.data_ = in_stack_ffffffffffffff58;
  this_00 = (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
             *)fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value);
  PLTerm::breakpoint((PLTerm *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_24 = 1;
  iVar1 = PLTerm::num_breakpoints((PLTerm *)0x4e7621);
  for (; local_24 < iVar1; local_24 = local_24 + 1) {
    in_stack_ffffffffffffff58 = *(char **)(in_RDI + 8);
    fmt::BasicStringRef<char>::BasicStringRef
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    value_00.size_ = (size_t)in_stack_ffffffffffffff60;
    value_00.data_ = in_stack_ffffffffffffff58;
    in_stack_ffffffffffffff60 =
         fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_00);
    PLTerm::breakpoint((PLTerm *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  value_04 = *(double *)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef
            (in_stack_ffffffffffffff30,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  value_01.size_ = (size_t)in_stack_ffffffffffffff60;
  value_01.data_ = in_stack_ffffffffffffff58;
  this_01 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_01);
  PLTerm::slope((PLTerm *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  fmt::BasicWriter<char>::operator<<(this_01,value_04);
  local_4c = 1;
  iVar1 = PLTerm::num_slopes((PLTerm *)0x4e771f);
  for (; precedence = (int)((ulong)uVar3 >> 0x20), local_4c < iVar1; local_4c = local_4c + 1) {
    in_stack_ffffffffffffff38 = *(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> **)(in_RDI + 8);
    fmt::BasicStringRef<char>::BasicStringRef
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    value_02.size_ = (size_t)in_stack_ffffffffffffff60;
    value_02.data_ = in_stack_ffffffffffffff58;
    in_stack_ffffffffffffff40.impl_ = (Impl *)fmt::BasicWriter<char>::operator<<(this_01,value_02);
    PLTerm::slope((PLTerm *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    fmt::BasicWriter<char>::operator<<(this_01,value_04);
  }
  this_02 = *(BasicStringRef<char> **)(in_RDI + 8);
  fmt::BasicStringRef<char>::BasicStringRef
            (this_02,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  tVar2 = (type)((ulong)this_02 >> 0x20);
  value_03.size_ = (size_t)in_stack_ffffffffffffff60;
  value_03.data_ = in_stack_ffffffffffffff58;
  fmt::BasicWriter<char>::operator<<(this_01,value_03);
  e_00.impl_ = (Impl *)PLTerm::arg((PLTerm *)
                                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            (in_stack_ffffffffffffff38,(Reference)in_stack_ffffffffffffff40.impl_,tVar2);
  Visit(this_00,(NumericExpr)e_00.impl_,precedence);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitPLTerm(PLTerm e) {
  writer_ << "<<" << e.breakpoint(0);
  for (int i = 1, n = e.num_breakpoints(); i < n; ++i)
    writer_ << ", " << e.breakpoint(i);
  writer_ << "; " << e.slope(0);
  for (int i = 1, n = e.num_slopes(); i < n; ++i)
    writer_ << ", " << e.slope(i);
  writer_ << ">> ";
  Visit( e.arg() );
}